

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O2

char * flatcc_json_parser_symbol_start(flatcc_json_parser_t *ctx,char *buf,char *end)

{
  if (buf != end) {
    if (*buf == '.') {
      if (ctx->error != 0) {
        return end;
      }
      ctx->error = 5;
      ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
      ctx->error_loc = buf;
      return end;
    }
    if (*buf == '\"') {
      buf = buf + 1;
      ctx->unquoted = 0;
    }
    else {
      ctx->unquoted = 1;
    }
  }
  return buf;
}

Assistant:

static inline const char *flatcc_json_parser_symbol_start(flatcc_json_parser_t *ctx, const char *buf, const char *end)
{
    if (buf == end) {
        return buf;
    }
    if (*buf == '\"') {
        ++buf;
#if FLATCC_JSON_PARSE_ALLOW_UNQUOTED
        ctx->unquoted = 0;
#endif
    } else {
#if FLATCC_JSON_PARSE_ALLOW_UNQUOTED
        if (*buf == '.') {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unexpected_character);
        }
        ctx->unquoted = 1;
#else
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unexpected_character);
#endif
    }
    return buf;
}